

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lagfib2xor.hpp
# Opt level: O1

basic_istream<wchar_t,_std::char_traits<wchar_t>_> *
trng::operator>>(basic_istream<wchar_t,_std::char_traits<wchar_t>_> *in,status_type *S)

{
  undefined4 uVar1;
  uint uVar2;
  basic_istream<wchar_t,_std::char_traits<wchar_t>_> *pbVar3;
  ulong uVar4;
  delim_c local_2039;
  undefined1 local_2038 [8200];
  
  memset(local_2038,0,0x2004);
  uVar1 = *(undefined4 *)(in + *(long *)(*(long *)in + -0x18) + 0x18);
  *(undefined4 *)(in + *(long *)(*(long *)in + -0x18) + 0x18) = 0x26;
  local_2039.c = '(';
  pbVar3 = utility::operator>>(in,&local_2039);
  std::wistream::_M_extract<unsigned_int>((uint *)pbVar3);
  uVar2 = int_math::ceil2<unsigned_int>(0x209);
  if (uVar2 != 0) {
    uVar4 = 0;
    do {
      local_2039.c = ' ';
      pbVar3 = utility::operator>>(in,&local_2039);
      std::wistream::_M_extract<unsigned_long>((ulong *)pbVar3);
      uVar4 = uVar4 + 1;
      uVar2 = int_math::ceil2<unsigned_int>(0x209);
    } while (uVar4 < uVar2);
  }
  local_2039.c = ')';
  utility::operator>>(in,&local_2039);
  if (((byte)in[*(long *)(*(long *)in + -0x18) + 0x20] & 5) == 0) {
    memcpy(S,local_2038,0x2004);
  }
  *(undefined4 *)(in + *(long *)(*(long *)in + -0x18) + 0x18) = uVar1;
  return in;
}

Assistant:

std::basic_istream<char_t, traits_t> &operator>>(
          std::basic_istream<char_t, traits_t> &in, status_type &S) {
        status_type S_new;
        std::ios_base::fmtflags flags(in.flags());
        in.flags(std::ios_base::dec | std::ios_base::fixed | std::ios_base::left);
        in >> utility::delim('(') >> S_new.index;
        for (unsigned int i{0}; i < S.size(); ++i)
          in >> utility::delim(' ') >> S_new.r[i];
        in >> utility::delim(')');
        if (in)
          S = S_new;
        in.flags(flags);
        return in;
      }